

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O1

void dlib::
     matrix_assign_big<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
                      *src)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  plVar1 = *(long **)src;
  lVar2 = plVar1[1];
  if (0 < lVar2) {
    lVar3 = plVar1[2];
    pfVar10 = (dest->data).data;
    lVar4 = (dest->data).nc_;
    lVar11 = 0;
    lVar12 = 0;
    do {
      if (0 < lVar3) {
        plVar5 = *(long **)(src + 8);
        lVar6 = *plVar5;
        lVar7 = plVar5[2];
        lVar8 = plVar1[3];
        lVar9 = *plVar1;
        lVar13 = 0;
        do {
          lVar14 = lVar12;
          if (lVar7 == 1) {
            lVar14 = plVar5[3] * lVar12;
          }
          pfVar10[lVar13] =
               *(float *)(lVar8 * lVar11 + lVar9 + lVar13 * 4) * *(float *)(lVar6 + lVar14 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar3 != lVar13);
      }
      lVar12 = lVar12 + 1;
      pfVar10 = pfVar10 + lVar4;
      lVar11 = lVar11 + 4;
    } while (lVar12 != lVar2);
  }
  return;
}

Assistant:

void matrix_assign_big (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    {
        matrix_assign_default(dest,src);
    }